

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void duckdb_je_base_delete(tsdn_t *tsdn,base_t *base)

{
  ehooks_t *peVar1;
  base_t *in_RSI;
  void *in_RDI;
  base_block_t *block;
  base_block_t *next;
  ehooks_t *ehooks;
  void *addr;
  uint ind;
  base_block_t *ehooks_00;
  base_block_t *tsdn_00;
  
  peVar1 = duckdb_je_base_ehooks_get_for_metadata(in_RSI);
  ehooks_00 = in_RSI->blocks;
  do {
    tsdn_00 = ehooks_00->next;
    addr = in_RDI;
    ind = (uint)((ulong)peVar1 >> 0x20);
    base_ind_get((base_t *)0x24c8b93);
    base_unmap((tsdn_t *)tsdn_00,(ehooks_t *)ehooks_00,ind,addr,0x24c8bb0);
    ehooks_00 = tsdn_00;
  } while (tsdn_00 != (base_block_t *)0x0);
  return;
}

Assistant:

void
base_delete(tsdn_t *tsdn, base_t *base) {
	ehooks_t *ehooks = base_ehooks_get_for_metadata(base);
	base_block_t *next = base->blocks;
	do {
		base_block_t *block = next;
		next = block->next;
		base_unmap(tsdn, ehooks, base_ind_get(base), block,
		    block->size);
	} while (next != NULL);
}